

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O2

void __thiscall rest_rpc::rpc_client::reset_socket(rpc_client *this)

{
  socket *this_00;
  int __oflag;
  error_code igored_ec;
  undefined4 local_80 [2];
  undefined8 local_78;
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
  local_70;
  
  local_80[0] = 0;
  local_78 = std::_V2::system_category();
  this_00 = &this->socket_;
  asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::close
            (&this_00->super_basic_socket<asio::ip::tcp,_asio::any_io_executor>,(int)local_80);
  asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::basic_socket<asio::io_context>
            ((basic_socket<asio::ip::tcp,_asio::any_io_executor> *)&local_70,&this->ios_,0);
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  operator=((io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
             *)this_00,&local_70);
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  ~io_object_impl(&local_70);
  if ((this->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.implementation_
      .super_base_implementation_type.socket_ == -1) {
    local_70.service_._0_4_ = 2;
    asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::open
              (&this_00->super_basic_socket<asio::ip::tcp,_asio::any_io_executor>,(char *)&local_70,
               __oflag);
  }
  return;
}

Assistant:

void reset_socket() {
    asio::error_code igored_ec;
    socket_.close(igored_ec);
    socket_ = decltype(socket_)(ios_);
    if (!socket_.is_open()) {
      socket_.open(asio::ip::tcp::v4());
    }
  }